

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O1

void __thiscall
Args::HelpPrinter::sortArg
          (HelpPrinter *this,ArgPtr *arg,
          vector<Args::Command_*,_std::allocator<Args::Command_*>_> *commands,
          vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *required,
          vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *optional,size_type *maxFlag,
          size_type *maxName,size_type *maxCommand,bool requiredAllOfGroup)

{
  pointer *pppCVar1;
  pointer *pppAVar2;
  ArgIface *pAVar3;
  iterator __position;
  iterator iVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  long *plVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  Command *local_e0;
  reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_> local_d8;
  undefined1 local_d0 [16];
  ArgIface local_c0 [4];
  _Bind<void_(Args::HelpPrinter::*(const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
  local_80;
  
  pAVar3 = (arg->_M_t).
           super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
           super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
           super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
  local_d8._M_data = required;
  if (pAVar3 == (ArgIface *)0x0) {
    plVar8 = (long *)0x0;
  }
  else {
    plVar8 = (long *)__dynamic_cast(pAVar3,&ArgIface::typeinfo,&GroupIface::typeinfo,0);
  }
  iVar7 = (*pAVar3->_vptr_ArgIface[2])(pAVar3);
  if (iVar7 == 0) {
    local_e0 = (Command *)
               (arg->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    __position._M_current =
         (commands->super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (commands->super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Args::Command*,std::allocator<Args::Command*>>::
      _M_realloc_insert<Args::Command*const&>
                ((vector<Args::Command*,std::allocator<Args::Command*>> *)commands,__position,
                 &local_e0);
    }
    else {
      *__position._M_current = local_e0;
      pppCVar1 = &(commands->super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
    (*(local_e0->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(local_d0);
    iVar7 = (*(local_e0->super_GroupIface).super_ArgIface._vptr_ArgIface[4])();
    if ((char)iVar7 == '\0') {
      lVar10 = 0;
    }
    else {
      iVar7 = (*(local_e0->super_GroupIface).super_ArgIface._vptr_ArgIface[9])();
      lVar10 = *(long *)(CONCAT44(extraout_var,iVar7) + 8) + 3;
    }
    if ((ArgIface *)local_d0._0_8_ != local_c0) {
      operator_delete((void *)local_d0._0_8_,(long)local_c0[0]._vptr_ArgIface + 1);
    }
    if ((ulong)(lVar10 + local_d0._8_8_) <= *maxCommand) {
      return;
    }
    *maxCommand = lVar10 + local_d0._8_8_;
    return;
  }
  if (plVar8 == (long *)0x0) {
    iVar7 = (*((arg->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[5])();
    if ((byte)((byte)iVar7 | requiredAllOfGroup) == 1) {
      local_d0._0_8_ =
           (arg->_M_t).
           super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
           super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
           super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
      iVar4._M_current = *(ArgIface ***)((long)local_d8._M_data + 8);
      if (iVar4._M_current == *(ArgIface ***)((long)local_d8._M_data + 0x10)) {
        std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>::
        _M_realloc_insert<Args::ArgIface*>
                  ((vector<Args::ArgIface*,std::allocator<Args::ArgIface*>> *)local_d8._M_data,iVar4
                   ,(ArgIface **)local_d0);
      }
      else {
        *iVar4._M_current = (ArgIface *)local_d0._0_8_;
        *(long *)((long)local_d8._M_data + 8) = *(long *)((long)local_d8._M_data + 8) + 8;
      }
    }
    else {
      local_d0._0_8_ =
           (arg->_M_t).
           super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
           super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
           super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
      iVar4._M_current =
           (optional->super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (optional->super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>::
        _M_realloc_insert<Args::ArgIface*>
                  ((vector<Args::ArgIface*,std::allocator<Args::ArgIface*>> *)optional,iVar4,
                   (ArgIface **)local_d0);
      }
      else {
        *iVar4._M_current = (ArgIface *)local_d0._0_8_;
        pppAVar2 = &(optional->
                    super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>)._M_impl
                    .super__Vector_impl_data._M_finish;
        *pppAVar2 = *pppAVar2 + 1;
      }
    }
    pAVar3 = (arg->_M_t).
             super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
             super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
             super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    iVar7 = (*pAVar3->_vptr_ArgIface[8])(pAVar3);
    if (*(long *)(CONCAT44(extraout_var_00,iVar7) + 8) == 0) {
      iVar7 = (*pAVar3->_vptr_ArgIface[7])(pAVar3);
      if (*(long *)(CONCAT44(extraout_var_02,iVar7) + 8) == 0) {
        (*pAVar3->_vptr_ArgIface[3])(local_d0,pAVar3);
        bVar5 = true;
        uVar9 = local_d0._8_8_;
      }
      else {
        bVar5 = false;
        uVar9 = 0;
      }
    }
    else {
      iVar7 = (*pAVar3->_vptr_ArgIface[8])();
      bVar5 = false;
      uVar9 = *(ulong *)(CONCAT44(extraout_var_01,iVar7) + 8);
    }
    if ((bVar5) && ((ArgIface *)local_d0._0_8_ != local_c0)) {
      operator_delete((void *)local_d0._0_8_,(long)local_c0[0]._vptr_ArgIface + 1);
    }
    iVar7 = (*pAVar3->_vptr_ArgIface[4])(pAVar3);
    uVar11 = 1;
    if ((char)iVar7 != '\0') {
      iVar7 = (*pAVar3->_vptr_ArgIface[9])(pAVar3);
      lVar10 = *(long *)(CONCAT44(extraout_var_03,iVar7) + 8);
      if (uVar9 == 0) {
        uVar11 = lVar10 + 4;
        uVar9 = 0;
      }
      else {
        uVar9 = uVar9 + lVar10 + 3;
      }
    }
    if (*maxFlag < uVar11) {
      *maxFlag = uVar11;
    }
    if (uVar9 <= *maxName) {
      return;
    }
    *maxName = uVar9;
    return;
  }
  cVar6 = (**(code **)(*plVar8 + 0x28))();
  if (cVar6 != '\0') {
    iVar7 = (**(code **)(*plVar8 + 0x10))(plVar8);
    local_80._M_bound_args.
    super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.
    super__Tuple_impl<8UL,_bool>.super__Head_base<8UL,_bool,_false>._M_head_impl =
         (_Head_base<8UL,_bool,_false>)true;
    if (iVar7 == 4) goto LAB_0010d388;
  }
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.super__Tuple_impl<8UL,_bool>.
  super__Head_base<8UL,_bool,_false>._M_head_impl = (_Head_base<8UL,_bool,_false>)false;
LAB_0010d388:
  local_80._M_f = (offset_in_HelpPrinter_to_subr)sortArg;
  local_80._8_8_ = 0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.
  super__Head_base<7UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)(reference_wrapper<unsigned_long>)maxCommand;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<6UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)(reference_wrapper<unsigned_long>)maxName;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       local_d8._M_data;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<5UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)(reference_wrapper<unsigned_long>)maxFlag;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       optional;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>)
       (reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>)commands;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<0UL,_const_Args::HelpPrinter_*,_false>._M_head_impl = this;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter_const*,std::_Placeholder<1>,std::reference_wrapper<std::vector<Args::Command*,std::allocator<Args::Command*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,bool))(std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const&,std::vector<Args::Command*,std::allocator<Args::Command*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,unsigned_long&,unsigned_long&,unsigned_long&,bool)const>>
            ((_Bind<void_(Args::HelpPrinter::*(const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
              *)local_d0,
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)plVar8[2],
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)plVar8[3],
             &local_80);
  return;
}

Assistant:

inline void
HelpPrinter::sortArg( const ArgPtr & arg,
	std::vector< Command* > & commands,
	std::vector< ArgIface* > & required,
	std::vector< ArgIface* > & optional,
	String::size_type & maxFlag,
	String::size_type & maxName,
	String::size_type & maxCommand,
	bool requiredAllOfGroup ) const
{
	GroupIface * g = dynamic_cast< GroupIface* > ( arg.get() );

	if( arg->type() == ArgType::Command )
	{
		Command * cmd = static_cast< Command* > ( arg.get() );

		commands.push_back( cmd );

		String::size_type length = cmd->name().length() + ( cmd->isWithValue() ?
			3 + cmd->valueSpecifier().length() : 0 );

		if( length > maxCommand )
			maxCommand = length;
	}
	else if( g )
	{
		if( g->isRequired() && g->type() == ArgType::AllOfGroup )
			requiredAllOfGroup = true;
		else
			requiredAllOfGroup = false;

		auto f = std::bind( &HelpPrinter::sortArg, this, std::placeholders::_1,
			std::ref( commands ), std::ref( required ),
			std::ref( optional ), std::ref( maxFlag ),
			std::ref( maxName ), std::ref( maxCommand ),
			requiredAllOfGroup );

		std::for_each( g->children().cbegin(),
			g->children().cend(), f );
	}
	else
	{
		if( arg->isRequired() || requiredAllOfGroup )
			required.push_back( arg.get() );
		else
			optional.push_back( arg.get() );

		calcMaxFlagAndName( arg.get(), maxFlag, maxName );
	}
}